

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

void Abc_NtkAppendToCone(Abc_Ntk_t *pNtkNew,Abc_Ntk_t *pNtk,Vec_Ptr_t *vRoots)

{
  Nm_Man_t *p;
  long *plVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  Vec_Ptr_t *__ptr;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  char *pcVar8;
  long lVar9;
  
  if (pNtkNew->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                  ,0x402,"void Abc_NtkAppendToCone(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                  ,0x403,"void Abc_NtkAppendToCone(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  __ptr = Abc_NtkDfsNodes(pNtk,(Abc_Obj_t **)vRoots->pArray,vRoots->nSize);
  pAVar5 = Abc_AigConst1(pNtkNew);
  pAVar6 = Abc_AigConst1(pNtk);
  (pAVar6->field_6).pCopy = pAVar5;
  pVVar7 = pNtk->vCis;
  if (0 < pVVar7->nSize) {
    lVar9 = 0;
    do {
      pAVar5 = (Abc_Obj_t *)pVVar7->pArray[lVar9];
      iVar3 = Abc_NodeIsTravIdCurrent(pAVar5);
      if (iVar3 != 0) {
        p = pNtkNew->pManName;
        pcVar8 = Abc_ObjName(pAVar5);
        uVar4 = Nm_ManFindIdByNameTwoTypes(p,pcVar8,2,5);
        if (uVar4 == 0xffffffff) {
          pAVar6 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_PI);
          (pAVar5->field_6).pCopy = pAVar6;
          pcVar8 = Abc_ObjName(pAVar5);
          Abc_ObjAssignName(pAVar6,pcVar8,(char *)0x0);
        }
        else {
          if (((int)uVar4 < 0) || (pNtkNew->vObjs->nSize <= (int)uVar4)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pAVar5->field_6 =
               *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)(pNtkNew->vObjs->pArray + uVar4);
        }
      }
      lVar9 = lVar9 + 1;
      pVVar7 = pNtk->vCis;
    } while (lVar9 < pVVar7->nSize);
  }
  if (0 < __ptr->nSize) {
    lVar9 = 0;
    do {
      plVar1 = (long *)__ptr->pArray[lVar9];
      lVar2 = *(long *)(*(long *)(*plVar1 + 0x20) + 8);
      pAVar5 = Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc,
                          (Abc_Obj_t *)
                          ((ulong)(*(uint *)((long)plVar1 + 0x14) >> 10 & 1) ^
                          *(ulong *)(*(long *)(lVar2 + (long)*(int *)plVar1[4] * 8) + 0x40)),
                          (Abc_Obj_t *)
                          ((ulong)(*(uint *)((long)plVar1 + 0x14) >> 0xb & 1) ^
                          *(ulong *)(*(long *)(lVar2 + (long)((int *)plVar1[4])[1] * 8) + 0x40)));
      plVar1[8] = (long)pAVar5;
      lVar9 = lVar9 + 1;
    } while (lVar9 < __ptr->nSize);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  iVar3 = Abc_NtkCheck(pNtkNew);
  if (iVar3 != 0) {
    return;
  }
  fwrite("Abc_NtkAppendToCone(): Network check has failed.\n",0x31,1,_stdout);
  return;
}

Assistant:

void Abc_NtkAppendToCone( Abc_Ntk_t * pNtkNew, Abc_Ntk_t * pNtk, Vec_Ptr_t * vRoots )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i, iNodeId;

    assert( Abc_NtkIsStrash(pNtkNew) );
    assert( Abc_NtkIsStrash(pNtk) );

    // collect the nodes in the TFI of the output (mark the TFI)
    vNodes = Abc_NtkDfsNodes( pNtk, (Abc_Obj_t **)Vec_PtrArray(vRoots), Vec_PtrSize(vRoots) );

    // establish connection between the constant nodes
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);

    // create the PIs
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        // skip CIs that are not used
        if ( !Abc_NodeIsTravIdCurrent(pObj) )
            continue;
        // find the corresponding CI in the new network
        iNodeId = Nm_ManFindIdByNameTwoTypes( pNtkNew->pManName, Abc_ObjName(pObj), ABC_OBJ_PI, ABC_OBJ_BO );
        if ( iNodeId == -1 )
        {
            pObj->pCopy = Abc_NtkCreatePi(pNtkNew);
            Abc_ObjAssignName( pObj->pCopy, Abc_ObjName(pObj), NULL );
        }
        else
            pObj->pCopy = Abc_NtkObj( pNtkNew, iNodeId );
    }

    // copy the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    Vec_PtrFree( vNodes );

    // do not add the COs
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkAppendToCone(): Network check has failed.\n" );
}